

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_parse_url_path(Curl_easy *data)

{
  connectdata *pcVar1;
  int iVar2;
  CURLcode CVar3;
  char local_438 [8];
  char localhost [1025];
  char *local_28;
  char *path;
  smtp_conn *smtpc;
  connectdata *conn;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  local_28 = (data->state).up.path + 1;
  if (*local_28 == '\0') {
    iVar2 = Curl_gethostname(local_438,0x401);
    if (iVar2 == 0) {
      local_28 = local_438;
    }
    else {
      local_28 = "localhost";
    }
  }
  CVar3 = Curl_urldecode(local_28,0,&(pcVar1->proto).ftpc.newhost,(size_t *)0x0,REJECT_CTRL);
  return CVar3;
}

Assistant:

static CURLcode smtp_parse_url_path(struct Curl_easy *data)
{
  /* The SMTP struct is already initialised in smtp_connect() */
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *path = &data->state.up.path[1]; /* skip leading path */
  char localhost[HOSTNAME_MAX + 1];

  /* Calculate the path if necessary */
  if(!*path) {
    if(!Curl_gethostname(localhost, sizeof(localhost)))
      path = localhost;
    else
      path = "localhost";
  }

  /* URL decode the path and use it as the domain in our EHLO */
  return Curl_urldecode(path, 0, &smtpc->domain, NULL, REJECT_CTRL);
}